

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeRepresentation::~IfcShapeRepresentation
          (IfcShapeRepresentation *this)

{
  ~IfcShapeRepresentation
            ((IfcShapeRepresentation *)
             ((long)&(this->super_IfcShapeModel).super_IfcRepresentation.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcShapeModel).super_IfcRepresentation.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcShapeRepresentation() : Object("IfcShapeRepresentation") {}